

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

Matrix33 *
AML::eulerAngleRatesMatrix_YXZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  double local_30;
  double dStack_28;
  undefined8 local_20;
  double local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  local_18 = 1.0 / dVar3;
  local_58 = dVar2 * dVar4 * local_18;
  dStack_50 = dVar3 * local_18;
  local_48 = -dVar1 * dVar4 * local_18;
  dStack_40 = dVar3 * dVar1 * local_18;
  local_38 = 0;
  local_30 = dVar3 * dVar2 * local_18;
  dStack_28 = -dVar2 * local_18;
  local_20 = 0;
  local_18 = local_18 * dVar1;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_YXZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double secTheta = 1.0 / cosTheta;

        double data[3][3] = { { sinPhi * sinTheta * secTheta, cosTheta * secTheta, -cosPhi * sinTheta * secTheta },
                              { cosPhi * cosTheta * secTheta, 0.0, sinPhi * cosTheta * secTheta },
                              { -sinPhi * secTheta, 0.0, cosPhi * secTheta } };

        return Matrix33(data);
    }